

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::Validator::Validator(Validator *this,string *validator_desc)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  anon_class_1_0_00000001 *__f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  anon_class_1_0_00000001 local_30 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  
  __f = local_30;
  ::std::__cxx11::string::string(in_RSI,in_stack_ffffffffffffffe8);
  ::std::function<std::__cxx11::string()>::
  function<CLI::Validator::Validator(std::__cxx11::string)::_lambda()_1_,void>
            ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)in_stack_ffffffffffffffc0,(anon_class_32_1_5ff8519c *)__f);
  Validator(std::__cxx11::string)::{lambda()#1}::~basic_string((anon_class_32_1_5ff8519c *)0x18e082)
  ;
  ::std::function<std::__cxx11::string(std::__cxx11::string&)>::
  function<CLI::Validator::func_::_lambda(std::__cxx11::string&)_1_,void>
            ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_ffffffffffffffc0,__f);
  ::std::__cxx11::string::string(in_stack_ffffffffffffffc0);
  *(undefined4 *)(in_RDI + 0x60) = 0xffffffff;
  *(undefined1 *)(in_RDI + 100) = 1;
  *(undefined1 *)(in_RDI + 0x65) = 0;
  return;
}

Assistant:

explicit Validator(std::string validator_desc) : desc_function_([validator_desc]() { return validator_desc; }) {}